

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  uint VAO;
  uint VBO;
  Shader ourShader;
  float vertices [18];
  GLuint local_84;
  GLuint local_80;
  Shader local_7c;
  undefined8 local_78 [9];
  
  bVar5 = 0;
  glfwInit();
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(800,600,"LearnOpenGL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to create GLFW window",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    glfwTerminate();
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 != 0) {
      (*glad_glEnable)(0xb71);
      Shader::Shader(&local_7c,"../shaders/learnopengl/3.3.shader.vs",
                     "../shaders/learnopengl/3.3.shader.fs");
      puVar3 = &DAT_001352b0;
      puVar4 = local_78;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      (*glad_glGenVertexArrays)(1,&local_84);
      (*glad_glGenBuffers)(1,&local_80);
      (*glad_glBindVertexArray)(local_84);
      (*glad_glBindBuffer)(0x8892,local_80);
      (*glad_glBufferData)(0x8892,0x48,local_78,0x88e4);
      (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
      (*glad_glEnableVertexAttribArray)(0);
      (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0x18,(void *)0xc);
      (*glad_glEnableVertexAttribArray)(1);
      iVar1 = glfwWindowShouldClose(handle);
      while (iVar1 == 0) {
        processInput(handle);
        (*glad_glClearColor)(0.2,0.3,0.3,1.0);
        (*glad_glClear)(0x4000);
        (*glad_glUseProgram)(local_7c.ID);
        (*glad_glBindVertexArray)(local_84);
        (*glad_glDrawArrays)(4,0,3);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        iVar1 = glfwWindowShouldClose(handle);
      }
      (*glad_glDeleteVertexArrays)(1,&local_84);
      (*glad_glDeleteBuffers)(1,&local_80);
      glfwTerminate();
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to initialize GLAD",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  return -1;
}

Assistant:

int main()
{
   // glfw: initialize and configure
   glfwInit();
   glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
   glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

#ifdef __APPLE__
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif

   // glfw window creation
   GLFWwindow* window = glfwCreateWindow(SCR_WIDTH, SCR_HEIGHT, "LearnOpenGL", nullptr,nullptr);
   if(window == nullptr)
   {
      std::cout << "Failed to create GLFW window" << std::endl;
      glfwTerminate();
      return -1;
   }
   glfwMakeContextCurrent(window);
   glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

   // glad: load all OpenGL function pointers
   if(!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress))
   {
      std::cout << "Failed to initialize GLAD" << std::endl;
      return -1;
   }

   // configure global opengl state
   // -------------------------------------------
   glEnable(GL_DEPTH_TEST);


   // build and compile our shader program
   // ---------------------------------------
   Shader ourShader("../shaders/learnopengl/3.3.shader.vs", "../shaders/learnopengl/3.3.shader.fs");
   
   // set up vertex data (and buffer(s)) and configure vertex attributes
   //-----------------------------------------------------------------
   float vertices[]{
      // positions       // colors
      0.5f, -0.5f, 0.0f, 1.0f, 0.0f, 0.0f,// bottom right
     -0.5f, -0.5f, 0.0f, 0.0f, 1.0f, 0.0f,// bottom left
      0.0f,  0.5f, 0.0f, 0.0f, 0.0f, 1.0f,// top
   };

   unsigned int VBO, VAO;
   glGenVertexArrays(1, &VAO);
   glGenBuffers(1, &VBO);
   // bind the Vertes Arrays Object first, then bind and set vertex buffer(s), and then configure vertex attributes(s).
   glBindVertexArray(VAO);

   glBindBuffer(GL_ARRAY_BUFFER, VBO);
   glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

   // position attribute
   glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 6 * sizeof(float), (void*)0);
   glEnableVertexAttribArray(0);

   // color atribute
   glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 6 * sizeof(float), (void*)(3 * sizeof(float)));
   glEnableVertexAttribArray(1);

    // uncomment this call to draw in wireframe polygons.
    //glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);

   // render loop
   //----------------------------------------
   while(!glfwWindowShouldClose(window))
   {
      // input
      processInput(window);
      
      // render
      glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
      glClear(GL_COLOR_BUFFER_BIT);

      ourShader.use();

      // draws the triangle
      glBindVertexArray(VAO); //not necessary here because we only have a single VAO but doing it anyway to keep things more organized
      glDrawArrays(GL_TRIANGLES, 0, 3);
      //glBindVertexArray(0); //no need to unbind it every time

      // glfw: swap buffers and poll IO events (keys pressed/released, mouse moved etc.)
      //------------------------------------------
      glfwSwapBuffers(window);
      glfwPollEvents();
   }

    // optional: de-allocate all resources once they've outlived their purpose:
    // ------------------------------------------------------------------------
    glDeleteVertexArrays(1, &VAO);
    glDeleteBuffers(1, &VBO);

   // glfw: terminate, clearing all previously allocated GLFW resources
   //---------------------------------------------------
   glfwTerminate();

   return 0;
}